

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O1

int stbi__create_png_image_raw
              (stbi__png *a,stbi_uc *raw,stbi__uint32 raw_len,int out_n,stbi__uint32 x,
              stbi__uint32 y,int depth,int color)

{
  long lVar1;
  byte bVar2;
  int a_00;
  uint uVar3;
  byte bVar4;
  int iVar5;
  uint uVar6;
  int iVar7;
  uint uVar8;
  stbi_uc *psVar9;
  void *__ptr;
  byte *pbVar10;
  ulong uVar11;
  long lVar12;
  byte bVar13;
  stbi__uint32 sVar14;
  uint uVar15;
  size_t __n;
  size_t sVar16;
  ushort *puVar17;
  ulong uVar18;
  ushort *src;
  byte *__src;
  byte bVar19;
  byte bVar20;
  uint uVar21;
  uint uVar22;
  size_t __n_00;
  uint uVar23;
  stbi_uc *dest;
  char cVar24;
  ulong uVar25;
  uint uVar26;
  byte *pbVar28;
  bool bVar29;
  ulong uVar27;
  
  bVar29 = depth == 0x10;
  iVar5 = x * out_n << bVar29;
  a_00 = a->s->img_n;
  uVar6 = a_00 << bVar29;
  if (a_00 + 1 != out_n && a_00 != out_n) {
    __assert_fail("out_n == s->img_n || out_n == s->img_n+1",
                  "/workspace/llm4binary/github/license_c_cmakelists/RobLoach[P]raylib-cpp/build_O1/_deps/raylib-src/src/external/stb_image.h"
                  ,0x1267,
                  "int stbi__create_png_image_raw(stbi__png *, stbi_uc *, stbi__uint32, int, stbi__uint32, stbi__uint32, int, int)"
                 );
  }
  psVar9 = (stbi_uc *)stbi__malloc_mad3(x,y,out_n << bVar29,0);
  a->out = psVar9;
  if (psVar9 == (stbi_uc *)0x0) {
    stbi__g_failure_reason = "outofmem";
    return 0;
  }
  iVar7 = stbi__mad3sizes_valid(a_00,x,depth,7);
  if (iVar7 != 0) {
    uVar8 = a_00 * x;
    uVar21 = uVar8 * depth + 7 >> 3;
    if ((int)y < 0) {
      bVar29 = true;
    }
    else if (y == 0) {
      bVar29 = false;
    }
    else {
      bVar29 = (uint)(0x7fffffff / (ulong)y) < uVar21;
    }
    if ((!bVar29) && ((int)(uVar21 * y) <= (int)(uVar21 ^ 0x7fffffff))) {
      if (raw_len < (uVar21 + 1) * y) {
        stbi__g_failure_reason = "not enough pixels";
        return 0;
      }
      __ptr = malloc((ulong)(uVar21 * 2));
      if (__ptr == (void *)0x0) {
        stbi__g_failure_reason = "outofmem";
        return 0;
      }
      uVar15 = 1;
      if (depth < 8) {
        uVar6 = 1;
      }
      if (y != 0) {
        sVar14 = x;
        if (depth < 8) {
          sVar14 = uVar21;
        }
        uVar15 = sVar14 * uVar6;
        __n_00 = (size_t)(int)uVar6;
        __n = (size_t)(int)uVar15;
        lVar1 = __n_00 + 1;
        bVar4 = 1;
        bVar20 = 1;
        uVar26 = 0;
        uVar25 = 0;
        do {
          uVar27 = (ulong)uVar26;
          uVar11 = 0;
          if ((uVar25 & 1) != 0) {
            uVar11 = (ulong)uVar21;
          }
          __src = raw + 1;
          bVar2 = *raw;
          uVar18 = (ulong)bVar2;
          if (uVar18 < 5) {
            if (uVar25 == 0) {
              uVar18 = (ulong)""[uVar18];
            }
            src = (ushort *)(uVar11 + (long)__ptr);
            psVar9 = a->out;
            if ((byte)uVar18 < 6) {
              uVar11 = (ulong)((bVar20 & 1) * uVar21);
              pbVar10 = (byte *)((long)__ptr + uVar11);
              switch(uVar18) {
              case 0:
                memcpy(src,__src,__n);
                break;
              case 1:
                memcpy(src,__src,__n_00);
                if ((int)uVar6 < (int)uVar15) {
                  lVar12 = 0;
                  do {
                    *(byte *)((long)src + lVar12 + __n_00) =
                         *(byte *)((long)src + lVar12) + raw[lVar12 + lVar1];
                    lVar12 = lVar12 + 1;
                  } while ((__n_00 - __n) + lVar12 != 0);
                }
                break;
              case 2:
                if (0 < (int)uVar15) {
                  uVar11 = 0;
                  do {
                    *(byte *)((long)src + uVar11) = pbVar10[uVar11] + __src[uVar11];
                    uVar11 = uVar11 + 1;
                  } while (uVar15 != uVar11);
                }
                break;
              case 3:
                if (0 < (int)uVar6) {
                  uVar18 = 0;
                  do {
                    *(byte *)((long)src + uVar18) = (pbVar10[uVar18] >> 1) + __src[uVar18];
                    uVar18 = uVar18 + 1;
                  } while (uVar6 != uVar18);
                }
                if ((int)uVar6 < (int)uVar15) {
                  pbVar10 = (byte *)((long)__ptr + uVar11 + __n_00);
                  pbVar28 = raw + lVar1;
                  sVar16 = __n;
                  puVar17 = src;
                  do {
                    *(byte *)((long)puVar17 + __n_00) =
                         (char)((uint)(byte)*puVar17 + (uint)*pbVar10 >> 1) + *pbVar28;
                    puVar17 = (ushort *)((long)puVar17 + 1);
                    pbVar28 = pbVar28 + 1;
                    pbVar10 = pbVar10 + 1;
                    sVar16 = sVar16 - 1;
                  } while (__n_00 != sVar16);
                }
                break;
              case 4:
                if (0 < (int)uVar6) {
                  uVar11 = 0;
                  do {
                    *(byte *)((long)src + uVar11) = pbVar10[uVar11] + __src[uVar11];
                    uVar11 = uVar11 + 1;
                  } while (uVar6 != uVar11);
                }
                if ((int)uVar6 < (int)uVar15) {
                  pbVar28 = raw + lVar1;
                  sVar16 = __n;
                  puVar17 = src;
                  do {
                    bVar13 = (byte)*puVar17;
                    bVar19 = *pbVar10;
                    uVar22 = (uint)bVar13;
                    iVar7 = (((uint)bVar19 + (uint)bVar19 * 2) - (uint)pbVar10[__n_00]) - uVar22;
                    uVar23 = (uint)pbVar10[__n_00];
                    uVar3 = uVar23;
                    if (uVar22 < uVar23) {
                      uVar3 = (uint)bVar13;
                    }
                    if (uVar23 < uVar22) {
                      uVar23 = (uint)bVar13;
                    }
                    uVar22 = (uint)bVar19;
                    if ((int)uVar23 <= iVar7) {
                      uVar22 = uVar3;
                    }
                    cVar24 = (char)uVar22;
                    if (iVar7 <= (int)uVar3) {
                      cVar24 = (char)uVar23;
                    }
                    *(byte *)((long)puVar17 + __n_00) = cVar24 + *pbVar28;
                    puVar17 = (ushort *)((long)puVar17 + 1);
                    pbVar10 = pbVar10 + 1;
                    pbVar28 = pbVar28 + 1;
                    sVar16 = sVar16 - 1;
                  } while (__n_00 != sVar16);
                }
                break;
              case 5:
                memcpy(src,__src,__n_00);
                if ((int)uVar6 < (int)uVar15) {
                  lVar12 = 0;
                  do {
                    *(byte *)((long)src + lVar12 + __n_00) =
                         (*(byte *)((long)src + lVar12) >> 1) + raw[lVar12 + lVar1];
                    lVar12 = lVar12 + 1;
                  } while ((__n_00 - __n) + lVar12 != 0);
                }
              }
            }
            dest = psVar9 + (uint)(iVar5 * (int)uVar25);
            __src = __src + __n;
            if (depth < 8) {
              bVar13 = 1;
              if (color == 0) {
                bVar13 = ""[depth];
              }
              if (depth == 4) {
                if (uVar8 != 0) {
                  uVar11 = 0;
                  bVar19 = 0;
                  do {
                    if ((uVar11 & 1) == 0) {
                      bVar19 = (byte)*src;
                      src = (ushort *)((long)src + 1);
                    }
                    psVar9[uVar11 + uVar27] = (bVar19 >> 4) * bVar13;
                    bVar19 = bVar19 << 4;
                    uVar11 = uVar11 + 1;
                  } while (uVar8 != (uint)uVar11);
                }
              }
              else if (depth == 2) {
                if (uVar8 != 0) {
                  uVar11 = 0;
                  bVar19 = 0;
                  do {
                    if ((uVar11 & 3) == 0) {
                      bVar19 = (byte)*src;
                      src = (ushort *)((long)src + 1);
                    }
                    psVar9[uVar11 + uVar27] = (bVar19 >> 6) * bVar13;
                    bVar19 = bVar19 << 2;
                    uVar11 = uVar11 + 1;
                  } while (uVar8 != (uint)uVar11);
                }
              }
              else {
                if (depth != 1) {
                  __assert_fail("depth == 1",
                                "/workspace/llm4binary/github/license_c_cmakelists/RobLoach[P]raylib-cpp/build_O1/_deps/raylib-src/src/external/stb_image.h"
                                ,0x12cb,
                                "int stbi__create_png_image_raw(stbi__png *, stbi_uc *, stbi__uint32, int, stbi__uint32, stbi__uint32, int, int)"
                               );
                }
                if (uVar8 != 0) {
                  uVar11 = 0;
                  bVar19 = 0;
                  do {
                    if ((uVar11 & 7) == 0) {
                      bVar19 = (byte)*src;
                      src = (ushort *)((long)src + 1);
                    }
                    psVar9[uVar11 + uVar27] = (char)bVar19 >> 7 & bVar13;
                    bVar19 = bVar19 * '\x02';
                    uVar11 = uVar11 + 1;
                  } while (uVar8 != (uint)uVar11);
                }
              }
              if (a_00 != out_n) {
                stbi__create_png_alpha_expand8(dest,dest,x,a_00);
              }
            }
            else if (depth == 8) {
              if (a_00 == out_n) {
                memcpy(dest,src,(ulong)uVar8);
              }
              else {
                stbi__create_png_alpha_expand8(dest,(stbi_uc *)src,x,a_00);
              }
            }
            else if (depth == 0x10) {
              if (a_00 == out_n) {
                if (uVar8 != 0) {
                  lVar12 = 0;
                  do {
                    *(ushort *)(psVar9 + lVar12 * 2 + uVar27) = src[lVar12] << 8 | src[lVar12] >> 8;
                    lVar12 = lVar12 + 1;
                  } while (uVar8 != (uint)lVar12);
                }
              }
              else {
                if (a_00 + 1 != out_n) {
                  __assert_fail("img_n+1 == out_n",
                                "/workspace/llm4binary/github/license_c_cmakelists/RobLoach[P]raylib-cpp/build_O1/_deps/raylib-src/src/external/stb_image.h"
                                ,0x12e4,
                                "int stbi__create_png_image_raw(stbi__png *, stbi_uc *, stbi__uint32, int, stbi__uint32, stbi__uint32, int, int)"
                               );
                }
                if (a_00 == 1) {
                  if (x != 0) {
                    lVar12 = 0;
                    do {
                      *(ushort *)(psVar9 + lVar12 * 4 + uVar27) =
                           src[lVar12] << 8 | src[lVar12] >> 8;
                      (psVar9 + lVar12 * 4 + uVar27 + 2)[0] = 0xff;
                      (psVar9 + lVar12 * 4 + uVar27 + 2)[1] = 0xff;
                      lVar12 = lVar12 + 1;
                    } while (x != (stbi__uint32)lVar12);
                  }
                }
                else {
                  if (a_00 != 3) {
                    __assert_fail("img_n == 3",
                                  "/workspace/llm4binary/github/license_c_cmakelists/RobLoach[P]raylib-cpp/build_O1/_deps/raylib-src/src/external/stb_image.h"
                                  ,0x12eb,
                                  "int stbi__create_png_image_raw(stbi__png *, stbi_uc *, stbi__uint32, int, stbi__uint32, stbi__uint32, int, int)"
                                 );
                  }
                  if (x != 0) {
                    lVar12 = 0;
                    do {
                      *(ushort *)(psVar9 + lVar12 * 8 + uVar27) = *src << 8 | *src >> 8;
                      *(ushort *)(psVar9 + lVar12 * 8 + uVar27 + 2) = src[1] << 8 | src[1] >> 8;
                      *(ushort *)(psVar9 + lVar12 * 8 + uVar27 + 4) = src[2] << 8 | src[2] >> 8;
                      (psVar9 + lVar12 * 8 + uVar27 + 6)[0] = 0xff;
                      (psVar9 + lVar12 * 8 + uVar27 + 6)[1] = 0xff;
                      src = src + 3;
                      lVar12 = lVar12 + 1;
                    } while (x != (stbi__uint32)lVar12);
                  }
                }
              }
            }
          }
          else {
            stbi__g_failure_reason = "invalid filter";
            bVar4 = 0;
          }
          if (4 < bVar2) break;
          uVar25 = uVar25 + 1;
          bVar20 = bVar20 + 1;
          uVar26 = uVar26 + iVar5;
          raw = __src;
        } while (uVar25 != y);
        uVar15 = (uint)bVar4;
      }
      free(__ptr);
      return uVar15;
    }
  }
  stbi__g_failure_reason = "too large";
  return 0;
}

Assistant:

static int stbi__create_png_image_raw(stbi__png *a, stbi_uc *raw, stbi__uint32 raw_len, int out_n, stbi__uint32 x, stbi__uint32 y, int depth, int color)
{
   int bytes = (depth == 16 ? 2 : 1);
   stbi__context *s = a->s;
   stbi__uint32 i,j,stride = x*out_n*bytes;
   stbi__uint32 img_len, img_width_bytes;
   stbi_uc *filter_buf;
   int all_ok = 1;
   int k;
   int img_n = s->img_n; // copy it into a local for later

   int output_bytes = out_n*bytes;
   int filter_bytes = img_n*bytes;
   int width = x;

   STBI_ASSERT(out_n == s->img_n || out_n == s->img_n+1);
   a->out = (stbi_uc *) stbi__malloc_mad3(x, y, output_bytes, 0); // extra bytes to write off the end into
   if (!a->out) return stbi__err("outofmem", "Out of memory");

   // note: error exits here don't need to clean up a->out individually,
   // stbi__do_png always does on error.
   if (!stbi__mad3sizes_valid(img_n, x, depth, 7)) return stbi__err("too large", "Corrupt PNG");
   img_width_bytes = (((img_n * x * depth) + 7) >> 3);
   if (!stbi__mad2sizes_valid(img_width_bytes, y, img_width_bytes)) return stbi__err("too large", "Corrupt PNG");
   img_len = (img_width_bytes + 1) * y;

   // we used to check for exact match between raw_len and img_len on non-interlaced PNGs,
   // but issue #276 reported a PNG in the wild that had extra data at the end (all zeros),
   // so just check for raw_len < img_len always.
   if (raw_len < img_len) return stbi__err("not enough pixels","Corrupt PNG");

   // Allocate two scan lines worth of filter workspace buffer.
   filter_buf = (stbi_uc *) stbi__malloc_mad2(img_width_bytes, 2, 0);
   if (!filter_buf) return stbi__err("outofmem", "Out of memory");

   // Filtering for low-bit-depth images
   if (depth < 8) {
      filter_bytes = 1;
      width = img_width_bytes;
   }

   for (j=0; j < y; ++j) {
      // cur/prior filter buffers alternate
      stbi_uc *cur = filter_buf + (j & 1)*img_width_bytes;
      stbi_uc *prior = filter_buf + (~j & 1)*img_width_bytes;
      stbi_uc *dest = a->out + stride*j;
      int nk = width * filter_bytes;
      int filter = *raw++;

      // check filter type
      if (filter > 4) {
         all_ok = stbi__err("invalid filter","Corrupt PNG");
         break;
      }

      // if first row, use special filter that doesn't sample previous row
      if (j == 0) filter = first_row_filter[filter];

      // perform actual filtering
      switch (filter) {
      case STBI__F_none:
         memcpy(cur, raw, nk);
         break;
      case STBI__F_sub:
         memcpy(cur, raw, filter_bytes);
         for (k = filter_bytes; k < nk; ++k)
            cur[k] = STBI__BYTECAST(raw[k] + cur[k-filter_bytes]);
         break;
      case STBI__F_up:
         for (k = 0; k < nk; ++k)
            cur[k] = STBI__BYTECAST(raw[k] + prior[k]);
         break;
      case STBI__F_avg:
         for (k = 0; k < filter_bytes; ++k)
            cur[k] = STBI__BYTECAST(raw[k] + (prior[k]>>1));
         for (k = filter_bytes; k < nk; ++k)
            cur[k] = STBI__BYTECAST(raw[k] + ((prior[k] + cur[k-filter_bytes])>>1));
         break;
      case STBI__F_paeth:
         for (k = 0; k < filter_bytes; ++k)
            cur[k] = STBI__BYTECAST(raw[k] + prior[k]); // prior[k] == stbi__paeth(0,prior[k],0)
         for (k = filter_bytes; k < nk; ++k)
            cur[k] = STBI__BYTECAST(raw[k] + stbi__paeth(cur[k-filter_bytes], prior[k], prior[k-filter_bytes]));
         break;
      case STBI__F_avg_first:
         memcpy(cur, raw, filter_bytes);
         for (k = filter_bytes; k < nk; ++k)
            cur[k] = STBI__BYTECAST(raw[k] + (cur[k-filter_bytes] >> 1));
         break;
      }

      raw += nk;

      // expand decoded bits in cur to dest, also adding an extra alpha channel if desired
      if (depth < 8) {
         stbi_uc scale = (color == 0) ? stbi__depth_scale_table[depth] : 1; // scale grayscale values to 0..255 range
         stbi_uc *in = cur;
         stbi_uc *out = dest;
         stbi_uc inb = 0;
         stbi__uint32 nsmp = x*img_n;

         // expand bits to bytes first
         if (depth == 4) {
            for (i=0; i < nsmp; ++i) {
               if ((i & 1) == 0) inb = *in++;
               *out++ = scale * (inb >> 4);
               inb <<= 4;
            }
         } else if (depth == 2) {
            for (i=0; i < nsmp; ++i) {
               if ((i & 3) == 0) inb = *in++;
               *out++ = scale * (inb >> 6);
               inb <<= 2;
            }
         } else {
            STBI_ASSERT(depth == 1);
            for (i=0; i < nsmp; ++i) {
               if ((i & 7) == 0) inb = *in++;
               *out++ = scale * (inb >> 7);
               inb <<= 1;
            }
         }

         // insert alpha=255 values if desired
         if (img_n != out_n)
            stbi__create_png_alpha_expand8(dest, dest, x, img_n);
      } else if (depth == 8) {
         if (img_n == out_n)
            memcpy(dest, cur, x*img_n);
         else
            stbi__create_png_alpha_expand8(dest, cur, x, img_n);
      } else if (depth == 16) {
         // convert the image data from big-endian to platform-native
         stbi__uint16 *dest16 = (stbi__uint16*)dest;
         stbi__uint32 nsmp = x*img_n;

         if (img_n == out_n) {
            for (i = 0; i < nsmp; ++i, ++dest16, cur += 2)
               *dest16 = (cur[0] << 8) | cur[1];
         } else {
            STBI_ASSERT(img_n+1 == out_n);
            if (img_n == 1) {
               for (i = 0; i < x; ++i, dest16 += 2, cur += 2) {
                  dest16[0] = (cur[0] << 8) | cur[1];
                  dest16[1] = 0xffff;
               }
            } else {
               STBI_ASSERT(img_n == 3);
               for (i = 0; i < x; ++i, dest16 += 4, cur += 6) {
                  dest16[0] = (cur[0] << 8) | cur[1];
                  dest16[1] = (cur[2] << 8) | cur[3];
                  dest16[2] = (cur[4] << 8) | cur[5];
                  dest16[3] = 0xffff;
               }
            }
         }
      }
   }

   STBI_FREE(filter_buf);
   if (!all_ok) return 0;

   return 1;
}